

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[5],pstack::ProgramHeaderName,char>
          (JObject *this,char (*k) [5],ProgramHeaderName *v,char *c)

{
  ostream *os;
  JSON<pstack::Field<char[5],_pstack::ProgramHeaderName>,_char> local_48;
  undefined1 local_38 [8];
  Field<char[5],_pstack::ProgramHeaderName> field;
  char *c_local;
  ProgramHeaderName *v_local;
  char (*k_local) [5];
  JObject *this_local;
  
  field.v = (ProgramHeaderName *)c;
  Field<char[5],_pstack::ProgramHeaderName>::Field
            ((Field<char[5],_pstack::ProgramHeaderName> *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[5],pstack::ProgramHeaderName>,char>
                       ((Field<char[5],_pstack::ProgramHeaderName> *)local_38,(char *)field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }